

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3ReleaseTempRange(Parse *pParse,int iReg,int nReg)

{
  int nReg_local;
  int iReg_local;
  Parse *pParse_local;
  
  if (nReg == 1) {
    sqlite3ReleaseTempReg(pParse,iReg);
  }
  else if (pParse->nRangeReg < nReg) {
    pParse->nRangeReg = nReg;
    pParse->iRangeReg = iReg;
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ReleaseTempRange(Parse *pParse, int iReg, int nReg){
  if( nReg==1 ){
    sqlite3ReleaseTempReg(pParse, iReg);
    return;
  }
  if( nReg>pParse->nRangeReg ){
    pParse->nRangeReg = nReg;
    pParse->iRangeReg = iReg;
  }
}